

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-builder.cpp
# Opt level: O0

void __thiscall
TypeTest_IndirectSelfSupertype_Test::TestBody(TypeTest_IndirectSelfSupertype_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  Entry EVar3;
  optional<wasm::HeapType> other;
  optional<wasm::HeapType> other_00;
  AssertHelper local_1f0;
  Message local_1e8;
  uint local_1dc;
  undefined1 local_1d8 [8];
  AssertionResult gtest_ar_1;
  Message local_1c0;
  ErrorReason local_1b4;
  undefined1 local_1b0 [8];
  AssertionResult gtest_ar;
  string local_198;
  AssertHelper local_178;
  Message local_170;
  undefined1 local_168 [8];
  AssertionResult gtest_ar__1;
  Error *error;
  AssertHelper local_130;
  Message local_128;
  bool local_119;
  undefined1 local_118 [8];
  AssertionResult gtest_ar_;
  BuildResult result;
  undefined1 local_d8 [12];
  Entry local_c8;
  Entry local_b8;
  undefined1 local_a8 [12];
  Entry local_98;
  Entry local_88;
  Struct local_78;
  Entry local_58;
  Struct local_48 [2];
  TypeBuilder local_18;
  TypeBuilder builder;
  TypeTest_IndirectSelfSupertype_Test *this_local;
  
  builder.impl._M_t.
  super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>._M_t
  .super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>.
  super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl =
       (unique_ptr<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>)
       (unique_ptr<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>)this;
  ::wasm::TypeBuilder::TypeBuilder(&local_18,2);
  ::wasm::TypeBuilder::createRecGroup((ulong)&local_18,0);
  local_48[0].fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48[0].fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48[0].fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::wasm::Struct::Struct(local_48);
  local_58 = ::wasm::TypeBuilder::operator[](&local_18,0);
  ::wasm::TypeBuilder::Entry::operator=(&local_58,local_48);
  ::wasm::Struct::~Struct(local_48);
  local_78.fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::wasm::Struct::Struct(&local_78);
  local_88 = ::wasm::TypeBuilder::operator[](&local_18,1);
  ::wasm::TypeBuilder::Entry::operator=(&local_88,&local_78);
  ::wasm::Struct::~Struct(&local_78);
  local_98 = ::wasm::TypeBuilder::operator[](&local_18,0);
  local_b8 = ::wasm::TypeBuilder::operator[](&local_18,1);
  std::optional<wasm::HeapType>::optional<wasm::TypeBuilder::Entry,_true>
            ((optional<wasm::HeapType> *)local_a8,&local_b8);
  other.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  other.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_a8._0_8_;
  other.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_a8[8];
  other.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_a8._9_3_;
  ::wasm::TypeBuilder::Entry::subTypeOf(&local_98,other);
  local_c8 = ::wasm::TypeBuilder::operator[](&local_18,1);
  EVar3 = ::wasm::TypeBuilder::operator[](&local_18,0);
  result.
  super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
  .
  super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
  .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._24_8_ =
       EVar3.builder;
  std::optional<wasm::HeapType>::optional<wasm::TypeBuilder::Entry,_true>
            ((optional<wasm::HeapType> *)local_d8,
             (Entry *)((long)&result.
                              super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                              .
                              super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                              .
                              super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                              .
                              super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                              .
                              super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                              .
                              super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                      + 0x18));
  other_00.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  other_00.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_d8._0_8_;
  other_00.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_d8[8];
  other_00.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_d8._9_3_;
  ::wasm::TypeBuilder::Entry::subTypeOf(&local_c8,other_00);
  ::wasm::TypeBuilder::build();
  bVar1 = ::wasm::TypeBuilder::BuildResult::operator_cast_to_bool
                    ((BuildResult *)&gtest_ar_.message_);
  local_119 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_118,&local_119,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_118);
  if (!bVar1) {
    testing::Message::Message(&local_128);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&error,(internal *)local_118,(AssertionResult *)0x4945b1,"true","false",
               in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_130,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
               ,0xe8,pcVar2);
    testing::internal::AssertHelper::operator=(&local_130,&local_128);
    testing::internal::AssertHelper::~AssertHelper(&local_130);
    std::__cxx11::string::~string((string *)&error);
    testing::Message::~Message(&local_128);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_118);
  gtest_ar__1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )::wasm::TypeBuilder::BuildResult::getError((BuildResult *)&gtest_ar_.message_);
  testing::AssertionResult::AssertionResult<wasm::TypeBuilder::Error_const*>
            ((AssertionResult *)local_168,(Error **)&gtest_ar__1.message_,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_168);
  if (!bVar1) {
    testing::Message::Message(&local_170);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_198,(internal *)local_168,(AssertionResult *)0x4a2453,"false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_178,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
               ,0xeb,pcVar2);
    testing::internal::AssertHelper::operator=(&local_178,&local_170);
    testing::internal::AssertHelper::~AssertHelper(&local_178);
    std::__cxx11::string::~string((string *)&local_198);
    testing::Message::~Message(&local_170);
  }
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._5_3_ = 0;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_168);
  if (gtest_ar.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ == 0) {
    local_1b4 = ForwardSupertypeReference;
    testing::internal::EqHelper::
    Compare<wasm::TypeBuilder::ErrorReason,_wasm::TypeBuilder::ErrorReason,_nullptr>
              ((EqHelper *)local_1b0,"error->reason",
               "TypeBuilder::ErrorReason::ForwardSupertypeReference",
               (ErrorReason *)
               ((long)gtest_ar__1.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl + 8),&local_1b4);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b0);
    if (!bVar1) {
      testing::Message::Message(&local_1c0);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1b0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                 ,0xec,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_1c0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
      testing::Message::~Message(&local_1c0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b0);
    local_1dc = 0;
    testing::internal::EqHelper::Compare<unsigned_long,_unsigned_int,_nullptr>
              ((EqHelper *)local_1d8,"error->index","0u",
               (unsigned_long *)
               gtest_ar__1.message_._M_t.
               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl,&local_1dc);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d8);
    if (!bVar1) {
      testing::Message::Message(&local_1e8);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1d8);
      testing::internal::AssertHelper::AssertHelper
                (&local_1f0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                 ,0xed,pcVar2);
      testing::internal::AssertHelper::operator=(&local_1f0,&local_1e8);
      testing::internal::AssertHelper::~AssertHelper(&local_1f0);
      testing::Message::~Message(&local_1e8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d8);
    gtest_ar.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_4_ = 0;
  }
  ::wasm::TypeBuilder::BuildResult::~BuildResult((BuildResult *)&gtest_ar_.message_);
  ::wasm::TypeBuilder::~TypeBuilder(&local_18);
  return;
}

Assistant:

TEST_F(TypeTest, IndirectSelfSupertype) {
  // Type is indirectly a supertype of itself.
  TypeBuilder builder(2);
  builder.createRecGroup(0, 2);
  builder[0] = Struct{};
  builder[1] = Struct{};
  builder[0].subTypeOf(builder[1]);
  builder[1].subTypeOf(builder[0]);

  auto result = builder.build();
  EXPECT_FALSE(result);

  const auto* error = result.getError();
  ASSERT_TRUE(error);
  EXPECT_EQ(error->reason, TypeBuilder::ErrorReason::ForwardSupertypeReference);
  EXPECT_EQ(error->index, 0u);
}